

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_byte_array_len_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  size_t sVar1;
  cram_codec *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  uchar *puVar7;
  cram_block *b_00;
  cram_block *b_01;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double local_68;
  double local_60;
  double local_58;
  size_t l;
  cram_block *b_val;
  cram_block *b_len;
  cram_codec *tc;
  int len3;
  int len2;
  int len;
  int version_local;
  char *prefix_local;
  cram_block *b_local;
  cram_codec *c_local;
  
  len3 = 0;
  if (prefix != (char *)0x0) {
    __n = strlen(prefix);
    while (b->alloc <= b->byte + __n) {
      if (b->alloc == 0) {
        local_58 = 1024.0;
      }
      else {
        sVar1 = b->alloc;
        auVar8._8_4_ = (int)(sVar1 >> 0x20);
        auVar8._0_8_ = sVar1;
        auVar8._12_4_ = 0x45300000;
        local_58 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
      }
      b->alloc = (long)local_58 | (long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f;
      puVar7 = (uchar *)realloc(b->data,b->alloc);
      b->data = puVar7;
    }
    memcpy(b->data + b->byte,prefix,__n);
    b->byte = __n + b->byte;
    len3 = (int)__n;
  }
  pcVar2 = (c->field_6).e_byte_array_len.len_codec;
  b_00 = cram_new_block(FILE_HEADER,0);
  iVar3 = (*pcVar2->store)(pcVar2,b_00,(char *)0x0,version);
  pcVar2 = (c->field_6).e_byte_array_len.val_codec;
  b_01 = cram_new_block(FILE_HEADER,0);
  iVar4 = (*pcVar2->store)(pcVar2,b_01,(char *)0x0,version);
  iVar5 = itf8_put_blk(b,c->codec);
  iVar6 = itf8_put_blk(b,iVar3 + iVar4);
  while (b->alloc <= b->byte + b_00->byte) {
    if (b->alloc == 0) {
      local_60 = 1024.0;
    }
    else {
      sVar1 = b->alloc;
      auVar9._8_4_ = (int)(sVar1 >> 0x20);
      auVar9._0_8_ = sVar1;
      auVar9._12_4_ = 0x45300000;
      local_60 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    b->alloc = (long)local_60 | (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
    puVar7 = (uchar *)realloc(b->data,b->alloc);
    b->data = puVar7;
  }
  memcpy(b->data + b->byte,b_00->data,b_00->byte);
  b->byte = b_00->byte + b->byte;
  while (b->alloc <= b->byte + b_01->byte) {
    if (b->alloc == 0) {
      local_68 = 1024.0;
    }
    else {
      sVar1 = b->alloc;
      auVar10._8_4_ = (int)(sVar1 >> 0x20);
      auVar10._0_8_ = sVar1;
      auVar10._12_4_ = 0x45300000;
      local_68 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    b->alloc = (long)local_68 | (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f;
    puVar7 = (uchar *)realloc(b->data,b->alloc);
    b->data = puVar7;
  }
  memcpy(b->data + b->byte,b_01->data,b_01->byte);
  b->byte = b_01->byte + b->byte;
  cram_free_block(b_00);
  cram_free_block(b_01);
  return iVar6 + iVar5 + len3 + iVar3 + iVar4;
}

Assistant:

int cram_byte_array_len_encode_store(cram_codec *c, cram_block *b,
				     char *prefix, int version) {
    int len = 0, len2, len3;
    cram_codec *tc;
    cram_block *b_len, *b_val;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tc = c->e_byte_array_len.len_codec; 
    b_len = cram_new_block(0, 0);
    len2 = tc->store(tc, b_len, NULL, version);

    tc = c->e_byte_array_len.val_codec;
    b_val = cram_new_block(0, 0);
    len3 = tc->store(tc, b_val, NULL, version);

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, len2+len3);
    BLOCK_APPEND(b, BLOCK_DATA(b_len), BLOCK_SIZE(b_len));
    BLOCK_APPEND(b, BLOCK_DATA(b_val), BLOCK_SIZE(b_val));

    cram_free_block(b_len);
    cram_free_block(b_val);

    return len + len2 + len3;
}